

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::calc_divu(PeleLM *this,Real time,Real dt,MultiFab *divu)

{
  bool bVar1;
  FabFactory<amrex::FArrayBox> *val;
  long lVar2;
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  Array4<double> *du;
  Array4<const_double> *extRhoH;
  Array4<const_double> *extY;
  Array4<const_double> *extRho;
  Array4<const_double> *rhoYdot;
  Array4<const_double> *vtY;
  Array4<const_double> *vtT;
  Array4<const_double> *T;
  Array4<const_double> *rhoY;
  Box *bx;
  MFIter mfi;
  MultiFab *RhoYdot;
  bool use_IR;
  MultiFab *S;
  MultiFab RhoYdotTmp;
  bool include_Wbar_terms;
  bool do_reflux_hold;
  MultiFab mcViscTerms;
  int vtCompY;
  int vtCompT;
  int nGrow;
  undefined4 in_stack_fffffffffffff640;
  int in_stack_fffffffffffff644;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff648;
  char *in_stack_fffffffffffff650;
  FabArray<amrex::FArrayBox> *this_00;
  undefined8 in_stack_fffffffffffff658;
  int state_indx;
  AmrLevel *in_stack_fffffffffffff660;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffff668;
  MFIter *in_stack_fffffffffffff670;
  BoxArray *in_stack_fffffffffffff678;
  MultiFab *in_stack_fffffffffffff680;
  anon_class_576_9_0175b633 *in_stack_fffffffffffff688;
  Box *in_stack_fffffffffffff690;
  MultiFab *local_968;
  undefined7 in_stack_fffffffffffff6a0;
  undefined1 uVar3;
  undefined1 local_938 [64];
  undefined1 auStack_8f8 [64];
  undefined1 auStack_8b8 [64];
  undefined1 auStack_878 [64];
  undefined1 auStack_838 [64];
  undefined1 auStack_7f8 [64];
  undefined1 auStack_7b8 [64];
  undefined1 auStack_778 [64];
  undefined1 auStack_738 [64];
  undefined1 local_6f8 [64];
  undefined1 *local_6b8;
  undefined1 local_6b0 [64];
  undefined1 *local_670;
  undefined1 local_668 [64];
  undefined1 *local_628;
  undefined1 local_620 [55];
  undefined1 in_stack_fffffffffffffa17;
  Real in_stack_fffffffffffffa18;
  Real in_stack_fffffffffffffa20;
  undefined1 *__src;
  MultiFab *in_stack_fffffffffffffa28;
  MultiFab *in_stack_fffffffffffffa30;
  PeleLM *in_stack_fffffffffffffa38;
  undefined1 local_590 [48];
  HowToFillGrow in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffaa4;
  Real in_stack_fffffffffffffaa8;
  MultiFab *in_stack_fffffffffffffab0;
  undefined1 *__src_00;
  MultiFab *in_stack_fffffffffffffab8;
  PeleLM *in_stack_fffffffffffffac0;
  undefined1 local_500 [64];
  undefined1 *local_4c0;
  undefined1 local_4b8 [64];
  undefined1 *local_478;
  undefined1 local_46c [132];
  undefined1 local_3e8 [56];
  Vector<int,_std::allocator<int>_> *pVStack_3b0;
  Vector<int,_std::allocator<int>_> *local_3a8;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *pVStack_3a0;
  Vector<int,_std::allocator<int>_> *local_398;
  MultiFab *local_390;
  byte local_381;
  FabArray<amrex::FArrayBox> *local_380;
  MultiFab local_378;
  undefined1 local_1f6;
  byte local_1f5;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  double local_20;
  double local_18;
  char *local_8;
  
  state_indx = (int)((ulong)in_stack_fffffffffffff658 >> 0x20);
  local_18 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_2c = 0;
  local_30 = 10;
  local_34 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1c8 = 0;
  local_20 = in_XMM1_Qa;
  amrex::MFInfo::MFInfo((MFInfo *)0x2d0d78);
  val = amrex::AmrLevel::Factory
                  ((AmrLevel *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
             (DistributionMapping *)in_stack_fffffffffffff670,
             (int)((ulong)in_stack_fffffffffffff668 >> 0x20),(int)in_stack_fffffffffffff668,
             (MFInfo *)in_stack_fffffffffffff660,
             (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff690);
  amrex::MFInfo::~MFInfo((MFInfo *)0x2d0dc4);
  local_1f5 = NavierStokesBase::do_reflux != 0;
  NavierStokesBase::do_reflux = 0;
  local_1f6 = 1;
  compute_differential_diffusion_terms
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
             in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(bool)in_stack_fffffffffffffa17);
  NavierStokesBase::do_reflux = (int)(local_1f5 & 1);
  amrex::MultiFab::MultiFab
            ((MultiFab *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  local_380 = &amrex::AmrLevel::get_data
                         (in_stack_fffffffffffff660,state_indx,(Real)in_stack_fffffffffffff650)->
               super_FabArray<amrex::FArrayBox>;
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff660 >> 0x38);
  uVar3 = false;
  if ((local_18 == 0.0) && (!NAN(local_18))) {
    uVar3 = 0.0 < local_20;
  }
  local_381 = uVar3;
  if ((bool)uVar3 == false) {
    local_968 = &local_378;
  }
  else {
    local_968 = amrex::AmrLevel::get_new_data
                          ((AmrLevel *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640)
                           ,(int)((ulong)val >> 0x20));
  }
  local_390 = local_968;
  if ((local_381 & 1) == 0) {
    if ((local_18 != 0.0) || (NAN(local_18))) {
      if (local_20 <= 0.0) {
        local_8 = "bad divu_logic - shouldn\'t be here";
        amrex::Abort_host(in_stack_fffffffffffff650);
      }
      else {
        lVar2 = in_RDI + 0xd8;
        in_stack_fffffffffffff668 = (FabArrayBase *)(in_RDI + 0x140);
        local_3e8._16_4_ = 0;
        local_3e8._20_4_ = 0;
        local_3e8._24_8_ = 0;
        local_3e8._0_8_ =
             (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
        local_3e8._8_8_ = (FabArrayBase *)0x0;
        local_3e8._32_8_ = 0;
        in_stack_fffffffffffff670 = (MFIter *)local_3e8;
        amrex::MFInfo::MFInfo((MFInfo *)0x2d10ae);
        val = amrex::AmrLevel::Factory
                        ((AmrLevel *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
        (*(local_968->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                  (local_968,lVar2,in_stack_fffffffffffff668,9,0,in_stack_fffffffffffff670);
        do_tiling_ = (undefined1)((ulong)lVar2 >> 0x38);
        amrex::MFInfo::~MFInfo((MFInfo *)0x2d10f5);
        compute_instantaneous_reaction_rates
                  (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                   in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0);
      }
    }
    else {
      lVar2 = in_RDI + 0xd8;
      in_stack_fffffffffffff688 = (anon_class_576_9_0175b633 *)(in_RDI + 0x140);
      local_3a8 = (Vector<int,_std::allocator<int>_> *)0x0;
      pVStack_3a0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x0;
      local_3e8._48_8_ = 0;
      pVStack_3b0 = (Vector<int,_std::allocator<int>_> *)0x0;
      local_398 = (Vector<int,_std::allocator<int>_> *)0x0;
      in_stack_fffffffffffff690 = (Box *)(local_3e8 + 0x30);
      amrex::MFInfo::MFInfo((MFInfo *)0x2d0f5f);
      val = amrex::AmrLevel::Factory
                      ((AmrLevel *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      (*(local_968->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                (local_968,lVar2,in_stack_fffffffffffff688,9,0,in_stack_fffffffffffff690);
      amrex::MFInfo::~MFInfo((MFInfo *)0x2d0fa6);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),(value_type)val);
    }
  }
  this_00 = local_380;
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter(in_stack_fffffffffffff670,in_stack_fffffffffffff668,(bool)do_tiling_);
  while (bVar1 = amrex::MFIter::isValid((MFIter *)(local_46c + 0x24)), bVar1) {
    amrex::MFIter::tilebox((MFIter *)CONCAT17(uVar3,in_stack_fffffffffffff6a0));
    local_46c._28_8_ = local_46c;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
    local_478 = local_4b8;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
    local_4c0 = local_500;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
    __src_00 = local_590;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff648,
               (MFIter *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
    __src = local_620;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
    local_628 = local_668;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)in_stack_fffffffffffff648,in_stack_fffffffffffff644);
    local_670 = local_6b0;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff648,
               (MFIter *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    local_6b8 = local_6f8;
    in_stack_fffffffffffff648 = (FabArray<amrex::FArrayBox> *)local_46c._28_8_;
    memcpy(local_938,local_478,0x3c);
    memcpy(auStack_8f8,local_4c0,0x3c);
    memcpy(auStack_8b8,&stack0xfffffffffffffab8,0x3c);
    memcpy(auStack_878,__src_00,0x3c);
    memcpy(auStack_838,&stack0xfffffffffffffa28,0x3c);
    memcpy(auStack_7f8,local_6b8,0x3c);
    memcpy(auStack_7b8,__src,0x3c);
    memcpy(auStack_778,local_628,0x3c);
    memcpy(auStack_738,local_670,0x3c);
    amrex::ParallelFor<PeleLM::calc_divu(double,double,amrex::MultiFab&)::__0>
              (in_stack_fffffffffffff690,in_stack_fffffffffffff688);
    amrex::MFIter::operator++((MFIter *)(local_46c + 0x24));
  }
  amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  amrex::EB_set_covered
            ((MultiFab *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),(Real)val);
  amrex::MultiFab::~MultiFab((MultiFab *)0x2d151d);
  amrex::MultiFab::~MultiFab((MultiFab *)0x2d152a);
  return;
}

Assistant:

void
PeleLM::calc_divu (Real      time,
                   Real      dt,
                   MultiFab& divu)
{
   BL_PROFILE("PLM::calc_divu()");

   const int nGrow = 0;
   int vtCompT = NUM_SPECIES + 1;
   int vtCompY = 0;
   MultiFab mcViscTerms(grids,dmap,NUM_SPECIES+2,nGrow,MFInfo(),Factory());

   // we don't want to update flux registers due to fluxes in divu computation
   bool do_reflux_hold = do_reflux;
   do_reflux = false;

   // DD is computed and stored in divu, and passed in to initialize the calc of divu
   bool include_Wbar_terms = true;
   compute_differential_diffusion_terms(mcViscTerms,divu,time,dt,include_Wbar_terms);

   do_reflux = do_reflux_hold;

   // if we are in the initial projection (time=0, dt=-1), set RhoYdot=0
   // if we are in a divu_iter (time=0, dt>0), use I_R
   // if we are in an init_iter or regular time step (time=dt, dt>0), use instananeous
   MultiFab   RhoYdotTmp;
   MultiFab&  S       = get_data(State_Type,time);
   const bool use_IR  = (time == 0 && dt > 0);

   MultiFab& RhoYdot = (use_IR) ? get_new_data(RhoYdot_Type) : RhoYdotTmp;

   if (!use_IR)
   {
     if (time == 0)
     {
       // initial projection, set omegadot to zero
       RhoYdot.define(grids,dmap,NUM_SPECIES,0,MFInfo(),Factory());
       RhoYdot.setVal(0.0);
     }
     else if (dt > 0)
     {
       // init_iter or regular time step, use instantaneous omegadot
       RhoYdot.define(grids,dmap,NUM_SPECIES,0,MFInfo(),Factory());
       compute_instantaneous_reaction_rates(RhoYdot,S,time,nGrow);
     }
     else
     {
       amrex::Abort("bad divu_logic - shouldn't be here");
     }
   }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& rhoY    = S.const_array(mfi,first_spec);
      auto const& T       = S.const_array(mfi,Temp);
      auto const& vtT     = mcViscTerms.const_array(mfi,vtCompT);
      auto const& vtY     = mcViscTerms.const_array(mfi,vtCompY);
      auto const& rhoYdot = RhoYdot.const_array(mfi);
      auto const& extRho  = external_sources.const_array(mfi,Density);
      auto const& extY    = external_sources.const_array(mfi,DEF_first_spec);
      auto const& extRhoH = external_sources.const_array(mfi,DEF_RhoH);
      auto const& du      = divu.array(mfi);

      amrex::ParallelFor(bx, [ rhoY, T, vtT, vtY, rhoYdot, du, extRho, extY, extRhoH]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         compute_divu( i, j, k, rhoY, T, vtT, vtY, rhoYdot, extRho, extY, extRhoH, du );
      });
   }

#ifdef AMREX_USE_EB
   EB_set_covered(divu,0.);
#endif
}